

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

ssize_t zt_cstr_rfind(char *s,ssize_t i,ssize_t j,char *str)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ssize_t sVar6;
  
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    lVar4 = 0;
    lVar5 = 0;
  }
  else {
    lVar3 = (i >> 0x3f & sVar2) + i;
    if ((long)sVar2 <= lVar3) {
      lVar3 = sVar2 - 1;
    }
    lVar5 = (j >> 0x3f & sVar2) + j;
    if ((long)sVar2 <= lVar5) {
      lVar5 = sVar2 - 1;
    }
    lVar4 = lVar5;
    if (lVar5 < lVar3) {
      lVar4 = lVar3;
    }
    if (lVar3 < lVar5) {
      lVar5 = lVar3;
    }
  }
  sVar2 = strlen(str);
  sVar6 = -1;
  if (sVar2 != 0) {
    if (sVar2 == 1) {
      for (; lVar5 <= lVar4; lVar4 = lVar4 + -1) {
        if (s[lVar4] == *str) {
          return lVar4;
        }
      }
    }
    lVar4 = (lVar4 - sVar2) + 1;
    while ((sVar6 = -1, lVar5 <= lVar4 &&
           (iVar1 = strncmp(s + lVar4,str,sVar2), sVar6 = lVar4, iVar1 != 0))) {
      lVar4 = lVar4 + -1;
    }
  }
  return sVar6;
}

Assistant:

ssize_t
zt_cstr_rfind(const char *s, ssize_t i, ssize_t j, const char *str) {
    size_t    len;
    ssize_t   offt;

    zt_assert(str);

    CONVERT(s, i, j);
    len = strlen(str);

    if (len == 0) {
        return -1;
    }

    if (len == 1) {
        for (; j >= i; j--) {
            if (s[j] == *str) {
                return j;
            }
        }
    }

    for (offt = j - len + 1; offt >= i; offt--) {
        if (strncmp(&s[offt], str, len) == 0) {
            return offt;
        }
    }

    return -1;
}